

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example5.cpp
# Opt level: O2

int main(void)

{
  bool bVar1;
  in_addr_t iVar2;
  int iVar3;
  ostream *poVar4;
  RTPPacket *p;
  uint uVar5;
  uint16_t destport;
  uint16_t portbase;
  int num;
  RTPTime RStack_10940;
  MyMemoryManager mgr;
  string ipstr;
  RTPIPv4Address addr;
  RTPUDPv4TransmissionParams RStack_108f0;
  RTPSessionParams sessparams;
  RTPSession sess;
  
  mgr.super_RTPMemoryManager._vptr_RTPMemoryManager = (_func_int **)&PTR__MyMemoryManager_00143fe0;
  mgr.alloccount = 0;
  mgr.freecount = 0;
  jrtplib::RTPSession::RTPSession(&sess,(RTPRandom *)0x0,&mgr.super_RTPMemoryManager);
  ipstr._M_dataplus._M_p = (pointer)&ipstr.field_2;
  ipstr._M_string_length = 0;
  ipstr.field_2._M_local_buf[0] = '\0';
  poVar4 = std::operator<<((ostream *)&std::cout,"Enter local portbase:");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
  std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
  poVar4 = std::operator<<((ostream *)&std::cout,"Enter the destination IP address");
  std::endl<char,std::char_traits<char>>(poVar4);
  std::operator>>((istream *)&std::cin,(string *)&ipstr);
  iVar2 = inet_addr(ipstr._M_dataplus._M_p);
  if (iVar2 == 0xffffffff) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Bad IP address specified");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar3 = -1;
  }
  else {
    poVar4 = std::operator<<((ostream *)&std::cout,"Enter the destination port");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::istream::_M_extract<unsigned_short>((ushort *)&std::cin);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    poVar4 = std::operator<<((ostream *)&std::cout,"Number of packets you wish to be sent:");
    std::endl<char,std::char_traits<char>>(poVar4);
    std::istream::operator>>((istream *)&std::cin,&num);
    RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    _M_node.super__List_node_base._M_next = (_List_node_base *)&RStack_108f0.localIPs;
    RStack_108f0.super_RTPTransmissionParams.protocol = IPv4UDPProto;
    RStack_108f0.super_RTPTransmissionParams._vptr_RTPTransmissionParams =
         (_func_int **)&PTR__RTPUDPv4TransmissionParams_00144038;
    RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    _M_node._M_size = 0;
    RStack_108f0.super_RTPTransmissionParams._12_2_ = 5000;
    RStack_108f0.bindIP = 0;
    RStack_108f0.mcastifaceIP = 0;
    RStack_108f0.multicastTTL = '\x01';
    RStack_108f0.rtpsendbuf = 0x8000;
    RStack_108f0.rtprecvbuf = 0x8000;
    RStack_108f0.rtcpsendbuf = 0x8000;
    RStack_108f0.rtcprecvbuf = 0x8000;
    RStack_108f0.m_pAbortDesc = (RTPAbortDescriptors *)0x0;
    RStack_108f0._68_5_ = 0;
    RStack_108f0.rtpsock._1_3_ = 0;
    RStack_108f0.rtcpsock = 0;
    RStack_108f0.useexistingsockets = false;
    RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    _M_node.super__List_node_base._M_prev =
         RStack_108f0.localIPs.super__List_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
         ._M_node.super__List_node_base._M_next;
    jrtplib::RTPSessionParams::RTPSessionParams(&sessparams);
    sessparams.owntsunit = 0.1;
    sessparams.acceptown = true;
    iVar3 = jrtplib::RTPSession::Create
                      (&sess,&sessparams,&RStack_108f0.super_RTPTransmissionParams,IPv4UDPProto);
    checkerror(iVar3);
    addr.super_RTPAddress._12_4_ =
         iVar2 >> 0x18 | (iVar2 & 0xff0000) >> 8 | (iVar2 & 0xff00) << 8 | iVar2 << 0x18;
    addr.super_RTPAddress.addresstype = IPv4Address;
    addr.super_RTPAddress._vptr_RTPAddress = (_func_int **)&PTR_CreateCopy_00144ce0;
    addr.rtcpsendport = destport + 1;
    iVar3 = jrtplib::RTPSession::AddDestination(&sess,&addr.super_RTPAddress);
    checkerror(iVar3);
    uVar5 = 1;
    while( true ) {
      if (num < (int)uVar5) break;
      printf("\nSending packet %d/%d\n",(ulong)uVar5);
      iVar3 = jrtplib::RTPSession::SendPacket(&sess,"1234567890",10,'\0',false,10);
      checkerror(iVar3);
      jrtplib::RTPSession::BeginDataAccess(&sess);
      bVar1 = jrtplib::RTPSession::GotoFirstSourceWithData(&sess);
      while (bVar1 != false) {
        while( true ) {
          p = jrtplib::RTPSession::GetNextPacket(&sess);
          if (p == (RTPPacket *)0x0) break;
          puts("Got packet !");
          jrtplib::RTPSession::DeletePacket(&sess,p);
        }
        bVar1 = jrtplib::RTPSession::GotoNextSourceWithData(&sess);
      }
      jrtplib::RTPSession::EndDataAccess(&sess);
      iVar3 = jrtplib::RTPSession::Poll(&sess);
      checkerror(iVar3);
      RStack_10940.m_t = 1.0;
      jrtplib::RTPTime::Wait(&RStack_10940);
      uVar5 = uVar5 + 1;
    }
    RStack_10940.m_t = 10.0;
    iVar3 = 0;
    jrtplib::RTPSession::BYEDestroy(&sess,&RStack_10940,(void *)0x0,0);
    std::__cxx11::string::~string((string *)&sessparams.cname);
    jrtplib::RTPUDPv4TransmissionParams::~RTPUDPv4TransmissionParams(&RStack_108f0);
  }
  std::__cxx11::string::~string((string *)&ipstr);
  jrtplib::RTPSession::~RTPSession(&sess);
  MyMemoryManager::~MyMemoryManager(&mgr);
  return iVar3;
}

Assistant:

int main(void)
{
#ifdef RTP_SOCKETTYPE_WINSOCK
	WSADATA dat;
	WSAStartup(MAKEWORD(2,2),&dat);
#endif // RTP_SOCKETTYPE_WINSOCK
	
	MyMemoryManager mgr;
	RTPSession sess(0, &mgr);
	uint16_t portbase,destport;
	uint32_t destip;
	std::string ipstr;
	int status,i,num;

        // First, we'll ask for the necessary information
		
	std::cout << "Enter local portbase:" << std::endl;
	std::cin >> portbase;
	std::cout << std::endl;
	
	std::cout << "Enter the destination IP address" << std::endl;
	std::cin >> ipstr;
	destip = inet_addr(ipstr.c_str());
	if (destip == INADDR_NONE)
	{
		std::cerr << "Bad IP address specified" << std::endl;
		return -1;
	}
	
	// The inet_addr function returns a value in network byte order, but
	// we need the IP address in host byte order, so we use a call to
	// ntohl
	destip = ntohl(destip);
	
	std::cout << "Enter the destination port" << std::endl;
	std::cin >> destport;
	
	std::cout << std::endl;
	std::cout << "Number of packets you wish to be sent:" << std::endl;
	std::cin >> num;
	
	// Now, we'll create a RTP session, set the destination, send some
	// packets and poll for incoming data.
	
	RTPUDPv4TransmissionParams transparams;
	RTPSessionParams sessparams;
	
	// IMPORTANT: The local timestamp unit MUST be set, otherwise
	//            RTCP Sender Report info will be calculated wrong
	// In this case, we'll be sending 10 samples each second, so we'll
	// put the timestamp unit to (1.0/10.0)
	sessparams.SetOwnTimestampUnit(1.0/10.0);		
	
	sessparams.SetAcceptOwnPackets(true);
	transparams.SetPortbase(portbase);
	status = sess.Create(sessparams,&transparams);	
	checkerror(status);
	
	RTPIPv4Address addr(destip,destport);
	
	status = sess.AddDestination(addr);
	checkerror(status);
	
	for (i = 1 ; i <= num ; i++)
	{
		printf("\nSending packet %d/%d\n",i,num);
		
		// send the packet
		status = sess.SendPacket((void *)"1234567890",10,0,false,10);
		checkerror(status);
		
		sess.BeginDataAccess();
		
		// check incoming packets
		if (sess.GotoFirstSourceWithData())
		{
			do
			{
				RTPPacket *pack;
				
				while ((pack = sess.GetNextPacket()) != NULL)
				{
					// You can examine the data here
					printf("Got packet !\n");
					
					// we don't longer need the packet, so
					// we'll delete it
					sess.DeletePacket(pack);
				}
			} while (sess.GotoNextSourceWithData());
		}
		
		sess.EndDataAccess();

#ifndef RTP_SUPPORT_THREAD
		status = sess.Poll();
		checkerror(status);
#endif // RTP_SUPPORT_THREAD
		
		RTPTime::Wait(RTPTime(1,0));
	}
	
	sess.BYEDestroy(RTPTime(10,0),0,0);

#ifdef RTP_SOCKETTYPE_WINSOCK
	WSACleanup();
#endif // RTP_SOCKETTYPE_WINSOCK
	return 0;
}